

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O1

int run_container_negation_range
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  uint uVar1;
  undefined8 in_RAX;
  run_container_t *prVar2;
  container_t *pcVar3;
  ulong uVar4;
  uint8_t return_typecode;
  undefined8 uStack_38;
  
  if (range_start < range_end) {
    uStack_38 = in_RAX;
    prVar2 = run_container_create_given_capacity(src->n_runs + 1);
    if (src->n_runs < 1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (range_start <= (int)(uint)src->runs[uVar4].value) break;
        prVar2->runs[uVar4] = src->runs[uVar4];
        prVar2->n_runs = prVar2->n_runs + 1;
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)src->n_runs);
    }
    run_container_smart_append_exclusive
              (prVar2,(ushort)range_start,~(ushort)range_start + (short)range_end);
    if ((int)uVar4 < src->n_runs) {
      uVar4 = uVar4 & 0xffffffff;
      do {
        run_container_smart_append_exclusive(prVar2,src->runs[uVar4].value,src->runs[uVar4].length);
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < src->n_runs);
    }
    pcVar3 = convert_run_to_efficient_container(prVar2,(uint8_t *)((long)&uStack_38 + 7));
    *dst = pcVar3;
    if (uStack_38._7_1_ != 3) {
      run_container_free(prVar2);
    }
    uVar1 = (uint)uStack_38._7_1_;
  }
  else {
    prVar2 = run_container_clone(src);
    *dst = prVar2;
    uVar1 = 3;
  }
  return uVar1;
}

Assistant:

int run_container_negation_range(const run_container_t *src,
                                 const int range_start, const int range_end,
                                 container_t **dst) {
    uint8_t return_typecode;

    // follows the Java implementation
    if (range_end <= range_start) {
        *dst = run_container_clone(src);
        return RUN_CONTAINER_TYPE;
    }

    run_container_t *ans = run_container_create_given_capacity(
        src->n_runs + 1);  // src->n_runs + 1);
    int k = 0;
    for (; k < src->n_runs && src->runs[k].value < range_start; ++k) {
        ans->runs[k] = src->runs[k];
        ans->n_runs++;
    }

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < src->n_runs; ++k) {
        run_container_smart_append_exclusive(ans, src->runs[k].value,
                                             src->runs[k].length);
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}